

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void aarch64_sync_32_to_64_arm(CPUARMState *env)

{
  uint uVar1;
  int iVar2;
  int local_14;
  uint32_t mode;
  int i;
  CPUARMState *env_local;
  
  uVar1 = env->uncached_cpsr & 0x1f;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    env->xregs[local_14] = (ulong)env->regs[local_14];
  }
  if (uVar1 == 0x11) {
    for (local_14 = 8; local_14 < 0xd; local_14 = local_14 + 1) {
      env->xregs[local_14] = (ulong)env->usr_regs[local_14 + -8];
    }
  }
  else {
    for (local_14 = 8; local_14 < 0xd; local_14 = local_14 + 1) {
      env->xregs[local_14] = (ulong)env->regs[local_14];
    }
  }
  if ((uVar1 == 0x10) || (uVar1 == 0x1f)) {
    env->xregs[0xd] = (ulong)env->regs[0xd];
    env->xregs[0xe] = (ulong)env->regs[0xe];
  }
  else {
    iVar2 = bank_number(0x10);
    env->xregs[0xd] = (ulong)env->banked_r13[iVar2];
    if (uVar1 == 0x1a) {
      env->xregs[0xe] = (ulong)env->regs[0xe];
    }
    else {
      iVar2 = r14_bank_number(0x10);
      env->xregs[0xe] = (ulong)env->banked_r14[iVar2];
    }
  }
  if (uVar1 == 0x1a) {
    env->xregs[0xf] = (ulong)env->regs[0xd];
  }
  else {
    iVar2 = bank_number(0x1a);
    env->xregs[0xf] = (ulong)env->banked_r13[iVar2];
  }
  if (uVar1 == 0x12) {
    env->xregs[0x10] = (ulong)env->regs[0xe];
    env->xregs[0x11] = (ulong)env->regs[0xd];
  }
  else {
    iVar2 = r14_bank_number(0x12);
    env->xregs[0x10] = (ulong)env->banked_r14[iVar2];
    iVar2 = bank_number(0x12);
    env->xregs[0x11] = (ulong)env->banked_r13[iVar2];
  }
  if (uVar1 == 0x13) {
    env->xregs[0x12] = (ulong)env->regs[0xe];
    env->xregs[0x13] = (ulong)env->regs[0xd];
  }
  else {
    iVar2 = r14_bank_number(0x13);
    env->xregs[0x12] = (ulong)env->banked_r14[iVar2];
    iVar2 = bank_number(0x13);
    env->xregs[0x13] = (ulong)env->banked_r13[iVar2];
  }
  if (uVar1 == 0x17) {
    env->xregs[0x14] = (ulong)env->regs[0xe];
    env->xregs[0x15] = (ulong)env->regs[0xd];
  }
  else {
    iVar2 = r14_bank_number(0x17);
    env->xregs[0x14] = (ulong)env->banked_r14[iVar2];
    iVar2 = bank_number(0x17);
    env->xregs[0x15] = (ulong)env->banked_r13[iVar2];
  }
  if (uVar1 == 0x1b) {
    env->xregs[0x16] = (ulong)env->regs[0xe];
    env->xregs[0x17] = (ulong)env->regs[0xd];
  }
  else {
    iVar2 = r14_bank_number(0x1b);
    env->xregs[0x16] = (ulong)env->banked_r14[iVar2];
    iVar2 = bank_number(0x1b);
    env->xregs[0x17] = (ulong)env->banked_r13[iVar2];
  }
  if (uVar1 == 0x11) {
    for (local_14 = 0x18; local_14 < 0x1f; local_14 = local_14 + 1) {
      env->xregs[local_14] = (ulong)env->regs[local_14 + -0x10];
    }
  }
  else {
    for (local_14 = 0x18; local_14 < 0x1d; local_14 = local_14 + 1) {
      env->xregs[local_14] = (ulong)env->fiq_regs[local_14 + -0x18];
    }
    iVar2 = bank_number(0x11);
    env->xregs[0x1d] = (ulong)env->banked_r13[iVar2];
    iVar2 = r14_bank_number(0x11);
    env->xregs[0x1e] = (ulong)env->banked_r14[iVar2];
  }
  env->pc = (ulong)env->regs[0xf];
  return;
}

Assistant:

void aarch64_sync_32_to_64(CPUARMState *env)
{
    int i;
    uint32_t mode = env->uncached_cpsr & CPSR_M;

    /* We can blanket copy R[0:7] to X[0:7] */
    for (i = 0; i < 8; i++) {
        env->xregs[i] = env->regs[i];
    }

    /*
     * Unless we are in FIQ mode, x8-x12 come from the user registers r8-r12.
     * Otherwise, they come from the banked user regs.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 8; i < 13; i++) {
            env->xregs[i] = env->usr_regs[i - 8];
        }
    } else {
        for (i = 8; i < 13; i++) {
            env->xregs[i] = env->regs[i];
        }
    }

    /*
     * Registers x13-x23 are the various mode SP and FP registers. Registers
     * r13 and r14 are only copied if we are in that mode, otherwise we copy
     * from the mode banked register.
     */
    if (mode == ARM_CPU_MODE_USR || mode == ARM_CPU_MODE_SYS) {
        env->xregs[13] = env->regs[13];
        env->xregs[14] = env->regs[14];
    } else {
        env->xregs[13] = env->banked_r13[bank_number(ARM_CPU_MODE_USR)];
        /* HYP is an exception in that it is copied from r14 */
        if (mode == ARM_CPU_MODE_HYP) {
            env->xregs[14] = env->regs[14];
        } else {
            env->xregs[14] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_USR)];
        }
    }

    if (mode == ARM_CPU_MODE_HYP) {
        env->xregs[15] = env->regs[13];
    } else {
        env->xregs[15] = env->banked_r13[bank_number(ARM_CPU_MODE_HYP)];
    }

    if (mode == ARM_CPU_MODE_IRQ) {
        env->xregs[16] = env->regs[14];
        env->xregs[17] = env->regs[13];
    } else {
        env->xregs[16] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_IRQ)];
        env->xregs[17] = env->banked_r13[bank_number(ARM_CPU_MODE_IRQ)];
    }

    if (mode == ARM_CPU_MODE_SVC) {
        env->xregs[18] = env->regs[14];
        env->xregs[19] = env->regs[13];
    } else {
        env->xregs[18] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_SVC)];
        env->xregs[19] = env->banked_r13[bank_number(ARM_CPU_MODE_SVC)];
    }

    if (mode == ARM_CPU_MODE_ABT) {
        env->xregs[20] = env->regs[14];
        env->xregs[21] = env->regs[13];
    } else {
        env->xregs[20] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_ABT)];
        env->xregs[21] = env->banked_r13[bank_number(ARM_CPU_MODE_ABT)];
    }

    if (mode == ARM_CPU_MODE_UND) {
        env->xregs[22] = env->regs[14];
        env->xregs[23] = env->regs[13];
    } else {
        env->xregs[22] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_UND)];
        env->xregs[23] = env->banked_r13[bank_number(ARM_CPU_MODE_UND)];
    }

    /*
     * Registers x24-x30 are mapped to r8-r14 in FIQ mode.  If we are in FIQ
     * mode, then we can copy from r8-r14.  Otherwise, we copy from the
     * FIQ bank for r8-r14.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 24; i < 31; i++) {
            env->xregs[i] = env->regs[i - 16];   /* X[24:30] <- R[8:14] */
        }
    } else {
        for (i = 24; i < 29; i++) {
            env->xregs[i] = env->fiq_regs[i - 24];
        }
        env->xregs[29] = env->banked_r13[bank_number(ARM_CPU_MODE_FIQ)];
        env->xregs[30] = env->banked_r14[r14_bank_number(ARM_CPU_MODE_FIQ)];
    }

    env->pc = env->regs[15];
}